

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O2

void __thiscall SuiteFieldMapTests::TesttotalFields::TesttotalFields(TesttotalFields *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"totalFields","FieldMapTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldMapTestCase.cpp"
             ,0x69);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031d1d0;
  return;
}

Assistant:

TEST(totalFields)
{
  FieldMap fieldMap;
  fieldMap.setField(1, "field1");
  fieldMap.setField(2, "field2");
  fieldMap.setField(3, "field3");

  FieldMap group1;
  group1.setField(4, "field4");
  fieldMap.addGroup(10, group1);
  FieldMap group2;
  group2.setField(5, "field5");
  group2.setField(6, "field6");
  fieldMap.addGroup(20, group2);

  CHECK_EQUAL(8, fieldMap.totalFields());
}